

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int copyPayload(void *pPayload,void *pBuf,int nByte,int eOp,DbPage *pDbPage)

{
  int iVar1;
  void *__src;
  
  __src = pPayload;
  if ((eOp == 0) || (iVar1 = sqlite3PagerWrite(pDbPage), __src = pBuf, pBuf = pPayload, iVar1 == 0))
  {
    memcpy(pBuf,__src,(long)nByte);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int copyPayload(
  void *pPayload,           /* Pointer to page data */
  void *pBuf,               /* Pointer to buffer */
  int nByte,                /* Number of bytes to copy */
  int eOp,                  /* 0 -> copy from page, 1 -> copy to page */
  DbPage *pDbPage           /* Page containing pPayload */
){
  if( eOp ){
    /* Copy data from buffer to page (a write operation) */
    int rc = sqlite3PagerWrite(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    memcpy(pPayload, pBuf, nByte);
  }else{
    /* Copy data from page to buffer (a read operation) */
    memcpy(pBuf, pPayload, nByte);
  }
  return SQLITE_OK;
}